

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int pem_get_iv(uchar *s,uchar *iv,size_t iv_len)

{
  uchar uVar1;
  byte bVar2;
  ulong uVar3;
  char cVar4;
  
  memset(iv,0,iv_len);
  if (iv_len != 0) {
    bVar2 = 0;
    uVar3 = 0;
    do {
      uVar1 = s[uVar3];
      cVar4 = -0x30;
      if (((9 < (byte)(uVar1 - 0x30)) && (cVar4 = -0x37, 5 < (byte)(uVar1 + 0xbf))) &&
         (cVar4 = -0x57, 5 < (byte)(uVar1 + 0x9f))) {
        return -0x1200;
      }
      iv[uVar3 >> 1] = iv[uVar3 >> 1] | cVar4 + uVar1 << (~bVar2 & 4);
      uVar3 = uVar3 + 1;
      bVar2 = bVar2 + 4;
    } while (iv_len * 2 + (ulong)(iv_len * 2 == 0) != uVar3);
  }
  return 0;
}

Assistant:

static int pem_get_iv( const unsigned char *s, unsigned char *iv,
                       size_t iv_len )
{
    size_t i, j, k;

    memset( iv, 0, iv_len );

    for( i = 0; i < iv_len * 2; i++, s++ )
    {
        if( *s >= '0' && *s <= '9' ) j = *s - '0'; else
        if( *s >= 'A' && *s <= 'F' ) j = *s - '7'; else
        if( *s >= 'a' && *s <= 'f' ) j = *s - 'W'; else
            return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

        k = ( ( i & 1 ) != 0 ) ? j : j << 4;

        iv[i >> 1] = (unsigned char)( iv[i >> 1] | k );
    }

    return( 0 );
}